

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
minus_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(minus_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,const_reference lhs,const_reference rhs,error_code *param_3)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *other;
  unsigned_long uVar4;
  unsigned_long uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  undefined8 extraout_RDX_02;
  size_t sVar7;
  double dVar8;
  double dVar9;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar10;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(rhs);
  if (bVar1) {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)param_3);
    if (bVar1) {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64(rhs);
      if (bVar1) {
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           param_3);
        if (!bVar1) goto LAB_003c0732;
        lVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
                          (rhs);
        lVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<long>
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           param_3);
        sVar7 = lVar2 - lVar3;
        *(undefined2 *)
         &(this->
          super_binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          )._vptr_binary_operator = 2;
        uVar6 = extraout_RDX;
LAB_003c0765:
        (this->
        super_binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ).precedence_level_ = sVar7;
      }
      else {
LAB_003c0732:
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64(rhs);
        if (bVar1) {
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             param_3);
          if (bVar1) {
            uVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    as_integer<unsigned_long>(rhs);
            uVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    as_integer<unsigned_long>
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               param_3);
            sVar7 = uVar4 - uVar5;
            *(undefined2 *)
             &(this->
              super_binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              )._vptr_binary_operator = 3;
            uVar6 = extraout_RDX_01;
            goto LAB_003c0765;
          }
        }
        dVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double(rhs);
        dVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           param_3);
        *(undefined2 *)
         &(this->
          super_binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          )._vptr_binary_operator = 5;
        (this->
        super_binary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ).precedence_level_ = (size_t)(dVar8 - dVar9);
        uVar6 = extraout_RDX_02;
      }
      goto LAB_003c0725;
    }
  }
  other = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,other);
  uVar6 = extraout_RDX_00;
LAB_003c0725:
  bVar10.field_0.int64_.val_ = uVar6;
  bVar10.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar10.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override
        {
            if (!(lhs.is_number() && rhs.is_number()))
            {
                return Json::null();
            }
            if (lhs.is_int64() && rhs.is_int64())
            {
                return Json(((lhs.template as<int64_t>() - rhs.template as<int64_t>())), semantic_tag::none);
            }
            if (lhs.is_uint64() && rhs.is_uint64())
            {
                return Json((lhs.template as<uint64_t>() - rhs.template as<uint64_t>()), semantic_tag::none);
            }
            return Json((lhs.as_double() - rhs.as_double()), semantic_tag::none);
        }